

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O2

void __thiscall
Gudhi::Toplex_map::
insert_independent_simplex<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Toplex_map *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range)

{
  pointer puVar1;
  size_type sVar2;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var3;
  pointer __k;
  Simplex_ptr key;
  Gudhi aGStack_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  get_key<std::vector<unsigned_long,std::allocator<unsigned_long>>>(aGStack_78,vertex_range);
  puVar1 = (vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (__k = (vertex_range->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
    sVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,__k);
    if (sVar2 == 0) {
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._4_4_ = 0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_68._M_buckets = &local_68._M_single_bucket;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<unsigned_long_const&,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<unsigned_long_const,std::unordered_set<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,Gudhi::Toplex_map::Sptr_hash,Gudhi::Toplex_map::Sptr_equal,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this,__k,&local_68);
      std::
      _Hashtable<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Identity,_Gudhi::Toplex_map::Sptr_equal,_Gudhi::Toplex_map::Sptr_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
    }
    p_Var3 = (_Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_Gudhi::Toplex_map::Sptr_hash,_Gudhi::Toplex_map::Sptr_equal,_std::allocator<std::shared_ptr<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)this,__k);
    std::
    _Hashtable<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>,std::allocator<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>,std::__detail::_Identity,Gudhi::Toplex_map::Sptr_equal,Gudhi::Toplex_map::Sptr_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_emplace<std::shared_ptr<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>&>
              (p_Var3,aGStack_78);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  return;
}

Assistant:

void Toplex_map::insert_independent_simplex(const Input_vertex_range& vertex_range) {
  auto key = get_key(vertex_range);
  for (const Vertex& v : vertex_range) {
    if (!t0.count(v)) t0.emplace(v, Simplex_ptr_set());
    t0.at(v).emplace(key);
  }
}